

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEnable.c
# Opt level: O2

void Gia_CollectSuper(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSuper)

{
  int iVar1;
  ulong uVar2;
  
  if (((ulong)pObj & 1) == 0) {
    vSuper->nSize = 0;
    uVar2 = *(ulong *)pObj & 0x1fffffff;
    if (uVar2 != 0x1fffffff && -1 < (int)*(ulong *)pObj) {
      iVar1 = Gia_ObjId(p,pObj + -uVar2);
      Vec_IntPushUnique(vSuper,iVar1);
      pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
    }
    iVar1 = Gia_ObjId(p,pObj);
    Vec_IntPushUnique(vSuper,iVar1);
    return;
  }
  __assert_fail("!Gia_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEnable.c"
                ,0x48,"void Gia_CollectSuper(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
}

Assistant:

void Gia_CollectSuper( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSuper )
{
    assert( !Gia_IsComplement(pObj) );
    Vec_IntClear( vSuper );
//    Gia_CollectSuper_rec( p, pObj, vSuper );
    if ( Gia_ObjIsAnd(pObj) )
    {
        Vec_IntPushUnique( vSuper, Gia_ObjId(p, Gia_ObjFanin0(pObj)) );
        Vec_IntPushUnique( vSuper, Gia_ObjId(p, Gia_ObjFanin1(pObj)) );
    }
    else
        Vec_IntPushUnique( vSuper, Gia_ObjId(p, Gia_Regular(pObj)) );

}